

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_butcher.c
# Opt level: O3

int arkode_butcher_order6k
              (sunrealtype *b,sunrealtype **A,sunrealtype *c1,sunrealtype *c2,sunrealtype *c3,
              sunrealtype *c4,int s)

{
  int iVar1;
  sunrealtype *x;
  sunrealtype *b_00;
  ulong uVar2;
  size_t __nmemb;
  ulong uVar3;
  double dVar4;
  
  __nmemb = (size_t)s;
  x = (sunrealtype *)calloc(__nmemb,8);
  b_00 = (sunrealtype *)calloc(__nmemb,8);
  if ((((0 < (long)__nmemb) && (c1 != (sunrealtype *)0x0)) && (c2 != (sunrealtype *)0x0)) &&
     (x != (sunrealtype *)0x0)) {
    uVar3 = (ulong)(uint)s;
    uVar2 = 0;
    do {
      x[uVar2] = c1[uVar2] * c2[uVar2];
      uVar2 = uVar2 + 1;
    } while (uVar3 != uVar2);
    if (b_00 != (sunrealtype *)0x0 && c3 != (sunrealtype *)0x0) {
      uVar2 = 0;
      do {
        b_00[uVar2] = c3[uVar2] * x[uVar2];
        uVar2 = uVar2 + 1;
      } while (uVar3 != uVar2);
      if (c4 != (sunrealtype *)0x0) {
        uVar2 = 0;
        do {
          x[uVar2] = c4[uVar2] * b_00[uVar2];
          uVar2 = uVar2 + 1;
        } while (uVar3 != uVar2);
        iVar1 = arkode_butcher_mv(A,x,s,b_00);
        if (iVar1 == 0) {
          if (b == (sunrealtype *)0x0) {
            return 0;
          }
          dVar4 = 0.0;
          uVar2 = 0;
          do {
            dVar4 = dVar4 + b[uVar2] * b_00[uVar2];
            uVar2 = uVar2 + 1;
          } while (uVar3 != uVar2);
          free(x);
          free(b_00);
          return (uint)(ABS(dVar4 + -0.03333333333333333) <= 1.4901161193847656e-08);
        }
      }
    }
  }
  free(x);
  free(b_00);
  return 0;
}

Assistant:

static sunbooleantype arkode_butcher_order6k(sunrealtype* b, sunrealtype** A,
                                             sunrealtype* c1, sunrealtype* c2,
                                             sunrealtype* c3, sunrealtype* c4,
                                             int s)
{
  sunrealtype bAcccc;
  sunrealtype* tmp1 = calloc(s, sizeof(sunrealtype));
  sunrealtype* tmp2 = calloc(s, sizeof(sunrealtype));
  if (arkode_butcher_vv(c1, c2, s, tmp1))
  {
    free(tmp1);
    free(tmp2);
    return (SUNFALSE);
  }
  if (arkode_butcher_vv(c3, tmp1, s, tmp2))
  {
    free(tmp1);
    free(tmp2);
    return (SUNFALSE);
  }
  if (arkode_butcher_vv(c4, tmp2, s, tmp1))
  {
    free(tmp1);
    free(tmp2);
    return (SUNFALSE);
  }
  if (arkode_butcher_mv(A, tmp1, s, tmp2))
  {
    free(tmp1);
    free(tmp2);
    return (SUNFALSE);
  }
  if (arkode_butcher_dot(b, tmp2, s, &bAcccc)) { return (SUNFALSE); }
  free(tmp1);
  free(tmp2);
  return (SUNRabs(bAcccc - SUN_RCONST(1.0) / SUN_RCONST(30.0)) > TOL) ? SUNFALSE
                                                                      : SUNTRUE;
}